

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cpu_instr_add_hl(gb_cpu_t *cpu,uint16_t value)

{
  uint16_t value_local;
  gb_cpu_t *cpu_local;
  
  sync_with_cpu(cpu,4);
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0xbf;
  (cpu->field_0).field_0.reg_f =
       (cpu->field_0).field_0.reg_f & 0xdf |
       ((int)(((cpu->field_3).reg_hl & 0xfff) + (value & 0xfff)) >> 0xc != 0) << 5;
  (cpu->field_0).field_0.reg_f =
       (cpu->field_0).field_0.reg_f & 0xef |
       ((int)((uint)(cpu->field_3).reg_hl + (uint)value) >> 0x10 != 0) << 4;
  (cpu->field_3).reg_hl = (cpu->field_3).reg_hl + value;
  return;
}

Assistant:

static inline void cpu_instr_add_hl(gb_cpu_t *cpu, uint16_t value)
{
    sync_with_cpu(cpu, 4); // internal

    SET_N(0);
    SET_H(CHECK_CARRY_12((cpu->reg_hl & 0xFFF) + (value & 0xFFF)));
    SET_C(CHECK_CARRY_16(cpu->reg_hl + value));

    cpu->reg_hl += value;
}